

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

void Abc_FlowRetime_AddInitBias(void)

{
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *p;
  void *Entry;
  uint uVar1;
  int iVar2;
  uint uVar3;
  Flow_Data_t *pFVar4;
  long *plVar5;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  int *piVar6;
  Abc_Obj_t *p_02;
  int iVar7;
  int iVar8;
  size_t __size;
  MinRegMan_t *pMVar9;
  long lVar10;
  int iVar11;
  
  pMVar9 = pManMR;
  pNtk = pManMR->pNtk;
  iVar8 = pManMR->vInitConstraints->nSize;
  iVar7 = pManMR->nNodes;
  iVar11 = (pManMR->iteration + 1) * iVar8;
  __size = (long)(iVar11 + iVar7) * 0x18;
  if (pManMR->pDataArray == (Flow_Data_t *)0x0) {
    pFVar4 = (Flow_Data_t *)malloc(__size);
  }
  else {
    pFVar4 = (Flow_Data_t *)realloc(pManMR->pDataArray,__size);
    iVar7 = pManMR->nNodes;
    iVar11 = (pManMR->iteration + 1) * iVar8;
    pMVar9 = pManMR;
  }
  pMVar9->pDataArray = pFVar4;
  memset(pFVar4 + iVar7,0,(long)iVar11 * 0x18);
  if (pMVar9->fVerbose != 0) {
    printf("\t\tcreating %d bias structures\n");
  }
  iVar8 = 0;
  do {
    if (pManMR->vInitConstraints->nSize <= iVar8) {
      return;
    }
    plVar5 = (long *)Vec_PtrEntry(pManMR->vInitConstraints,iVar8);
    if (*plVar5 == 0) {
      Abc_NtkCreateObj(pNtk,ABC_OBJ_BLACKBOX);
      for (iVar7 = 0; iVar7 < *(int *)((long)plVar5 + 0xc); iVar7 = iVar7 + 1) {
        iVar11 = Vec_IntEntry((Vec_Int_t *)(plVar5 + 1),iVar7);
        pObj = Abc_NtkObj(pNtk,iVar11);
        iVar11 = Vec_IntEntry((Vec_Int_t *)(plVar5 + 3),iVar7);
        p_00 = Vec_PtrAlloc(1);
        p_01 = (Vec_Int_t *)malloc(0x10);
        p_01->nCap = 0x10;
        p_01->nSize = 0;
        piVar6 = (int *)malloc(0x40);
        p_01->pArray = piVar6;
        p = pObj->pNtk;
        Vec_PtrPush(p_00,pObj);
        Vec_IntPush(p_01,0);
        Abc_NtkIncrementTravId(p);
        while (p_00->nSize != 0) {
          p_02 = (Abc_Obj_t *)Vec_PtrPop(p_00);
          if (p_01->nSize < 1) {
            __assert_fail("p->nSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x396,"int Vec_IntPop(Vec_Int_t *)");
          }
          uVar1 = p_01->nSize - 1;
          p_01->nSize = uVar1;
          uVar1 = p_01->pArray[uVar1];
          iVar2 = Abc_NodeIsTravIdCurrent(p_02);
          if (iVar2 == 0) {
            Abc_NodeSetTravIdCurrent(p_02);
            uVar3 = *(uint *)&p_02->field_0x14 & 0xf;
            if (((uVar3 != 5) && (uVar3 != 8)) &&
               (iVar2 = Abc_FlowRetime_GetLag(pObj), iVar2 + uVar1 == iVar11)) {
              *(ushort *)(pManMR->pDataArray + (uint)p_02->Id) =
                   *(ushort *)(pManMR->pDataArray + (uint)p_02->Id) | 0x10;
            }
            for (lVar10 = 0; lVar10 < (p_02->vFanouts).nSize; lVar10 = lVar10 + 1) {
              Entry = p_02->pNtk->vObjs->pArray[(p_02->vFanouts).pArray[lVar10]];
              uVar3 = *(uint *)((long)Entry + 0x14) & 0xf;
              if (((uVar3 < 9) && ((0x130U >> uVar3 & 1) != 0)) ||
                 ((*(uint *)&p_02->field_0x14 & 0xf) == 5)) {
                Vec_PtrPush(p_00,Entry);
                Vec_IntPush(p_01,(uint)(uVar1 != ((*(uint *)((long)Entry + 0x14) & 0xf) == 8)));
              }
            }
          }
        }
        Vec_PtrFree(p_00);
        free(p_01->pArray);
        free(p_01);
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void Abc_FlowRetime_AddInitBias( ) {
  Abc_Ntk_t *pNtk = pManMR->pNtk;
  Abc_Obj_t *pBiasNode, *pObj;
  InitConstraint_t *pConstraint;
  int i, j, id;
  const int nConstraints = Vec_PtrSize( pManMR->vInitConstraints );

  pManMR->pDataArray = ABC_REALLOC( Flow_Data_t, pManMR->pDataArray, pManMR->nNodes + (nConstraints*(pManMR->iteration+1)) );
  memset(pManMR->pDataArray + pManMR->nNodes, 0, sizeof(Flow_Data_t)*(nConstraints*(pManMR->iteration+1)));

  vprintf("\t\tcreating %d bias structures\n", nConstraints);

  Vec_PtrForEachEntry(InitConstraint_t*, pManMR->vInitConstraints, pConstraint, i ) {
    if (pConstraint->pBiasNode) continue;
    
 //   printf("\t\t\tbias %d...\n", i);
    pBiasNode = Abc_NtkCreateBlackbox( pNtk );

    Vec_IntForEachEntry( &pConstraint->vNodes, id, j ) {
      pObj = Abc_NtkObj(pNtk, id);
      Abc_FlowRetime_ConnectBiasNode(pBiasNode, pObj, Vec_IntEntry(&pConstraint->vLags, j));
    }

    // pConstraint->pBiasNode = pBiasNode;
  }
}